

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::SubGridIntersector1Moeller<8,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  byte bVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  byte bVar39;
  byte bVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  Geometry *geometry;
  long lVar52;
  ulong uVar53;
  uint uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined4 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  float fVar83;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  undefined1 auVar87 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar104;
  float fVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  uint uVar109;
  uint uVar110;
  float fVar111;
  float fVar112;
  uint uVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2764;
  RTCIntersectArguments *local_2760;
  ulong local_2758;
  ulong local_2750;
  RTCRayQueryContext *local_2748;
  ulong local_2740;
  ulong local_2738;
  ulong local_2730;
  ulong local_2728;
  ulong local_2720;
  ulong local_2718;
  ulong *local_2710;
  ulong local_2708;
  ulong local_2700;
  ulong local_26f8;
  ulong local_26f0;
  ulong local_26e8;
  ulong local_26e0;
  long local_26d8;
  long local_26d0;
  long local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  float local_2684;
  float local_2680;
  uint local_267c;
  undefined4 local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  byte local_259f;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2710 = local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar86 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar55._8_4_ = 0x7fffffff;
    auVar55._0_8_ = 0x7fffffff7fffffff;
    auVar55._12_4_ = 0x7fffffff;
    auVar55 = vandps_avx512vl((undefined1  [16])aVar2,auVar55);
    local_2398[0] = 0;
    auVar95._8_4_ = 0x219392ef;
    auVar95._0_8_ = 0x219392ef219392ef;
    auVar95._12_4_ = 0x219392ef;
    uVar53 = vcmpps_avx512vl(auVar55,auVar95,1);
    bVar13 = (bool)((byte)uVar53 & 1);
    auVar56._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * (int)aVar2.x;
    bVar13 = (bool)((byte)(uVar53 >> 1) & 1);
    auVar56._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * (int)aVar2.y;
    bVar13 = (bool)((byte)(uVar53 >> 2) & 1);
    auVar56._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * (int)aVar2.z;
    bVar13 = (bool)((byte)(uVar53 >> 3) & 1);
    auVar56._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * aVar2.field_3.a;
    auVar55 = vrcp14ps_avx512vl(auVar56);
    auVar57._8_4_ = 0x3f800000;
    auVar57._0_8_ = 0x3f8000003f800000;
    auVar57._12_4_ = 0x3f800000;
    auVar57 = vfnmadd213ps_avx512vl(auVar56,auVar55,auVar57);
    auVar56 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
    fVar80 = auVar56._0_4_;
    auVar58 = vbroadcastss_avx512vl(auVar56);
    auVar115 = ZEXT3264(auVar58);
    auVar55 = vmovshdup_avx(auVar56);
    auVar58 = vbroadcastsd_avx512vl(auVar55);
    auVar116 = ZEXT3264(auVar58);
    auVar57 = vshufpd_avx(auVar56,auVar56,1);
    auVar62._8_4_ = 2;
    auVar62._0_8_ = 0x200000002;
    auVar62._12_4_ = 2;
    auVar62._16_4_ = 2;
    auVar62._20_4_ = 2;
    auVar62._24_4_ = 2;
    auVar62._28_4_ = 2;
    auVar58 = vpermps_avx512vl(auVar62,ZEXT1632(auVar56));
    auVar117 = ZEXT3264(auVar58);
    fVar81 = fVar80 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar65._4_4_ = fVar81;
    auVar65._0_4_ = fVar81;
    auVar65._8_4_ = fVar81;
    auVar65._12_4_ = fVar81;
    auVar65._16_4_ = fVar81;
    auVar65._20_4_ = fVar81;
    auVar65._24_4_ = fVar81;
    auVar65._28_4_ = fVar81;
    auVar58 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar118 = ZEXT3264(auVar58);
    auVar60 = ZEXT1632(CONCAT412(auVar56._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar56._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar56._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar81))
                                ));
    auVar59 = vpermps_avx512vl(auVar58,auVar60);
    auVar58 = vpermps_avx2(auVar62,auVar60);
    uVar53 = (ulong)(fVar80 < 0.0) << 5;
    uVar45 = (ulong)(auVar55._0_4_ < 0.0) << 5 | 0x40;
    uVar47 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x80;
    uVar48 = uVar53 ^ 0x20;
    uVar49 = uVar45 ^ 0x20;
    uVar50 = uVar47 ^ 0x20;
    auVar61._8_4_ = 0x80000000;
    auVar61._0_8_ = 0x8000000080000000;
    auVar61._12_4_ = 0x80000000;
    auVar61._16_4_ = 0x80000000;
    auVar61._20_4_ = 0x80000000;
    auVar61._24_4_ = 0x80000000;
    auVar61._28_4_ = 0x80000000;
    auVar60 = vbroadcastss_avx512vl(auVar86);
    auVar120 = ZEXT3264(auVar60);
    auVar60 = vxorps_avx512vl(auVar65,auVar61);
    auVar119 = ZEXT3264(auVar60);
    auVar59 = vxorps_avx512vl(auVar59,auVar61);
    auVar121 = ZEXT3264(auVar59);
    auVar58 = vxorps_avx512vl(auVar58,auVar61);
    auVar122 = ZEXT3264(auVar58);
    auVar58 = vbroadcastss_avx512vl(auVar14);
    auVar123 = ZEXT3264(auVar58);
    local_26e0 = (ulong)(((uint)(fVar80 < 0.0) << 5) >> 2);
    local_26e8 = uVar48 >> 2;
    local_26f0 = uVar45 >> 2;
    local_26f8 = uVar49 >> 2;
    local_2700 = uVar47 >> 2;
    auVar58 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar124 = ZEXT3264(auVar58);
    auVar101 = ZEXT3264(CONCAT428(0xfffffff8,
                                  CONCAT424(0xfffffff8,
                                            CONCAT420(0xfffffff8,
                                                      CONCAT416(0xfffffff8,
                                                                CONCAT412(0xfffffff8,
                                                                          CONCAT48(0xfffffff8,
                                                                                                                                                                      
                                                  0xfffffff8fffffff8)))))));
    local_2708 = uVar50 >> 2;
    local_2718 = uVar53;
    local_2720 = uVar45;
    local_2728 = uVar47;
    local_2730 = uVar48;
    local_2738 = uVar49;
    local_2740 = uVar50;
    do {
      pfVar1 = (float *)(local_2710 + -1);
      local_2710 = local_2710 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar44 = *local_2710;
        while ((uVar44 & 8) == 0) {
          auVar58 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar44 + 0x40 + uVar53),auVar119._0_32_,
                               auVar115._0_32_);
          auVar59 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar44 + 0x40 + uVar45),auVar121._0_32_,
                               auVar116._0_32_);
          auVar58 = vpmaxsd_avx2(auVar58,auVar59);
          auVar60 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar44 + 0x40 + uVar47),auVar122._0_32_,
                               auVar117._0_32_);
          auVar59 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar44 + 0x40 + uVar48),auVar119._0_32_,
                               auVar115._0_32_);
          auVar61 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar44 + 0x40 + uVar49),auVar121._0_32_,
                               auVar116._0_32_);
          auVar59 = vpminsd_avx2(auVar59,auVar61);
          auVar61 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar44 + 0x40 + uVar50),auVar122._0_32_,
                               auVar117._0_32_);
          auVar60 = vpmaxsd_avx512vl(auVar60,auVar123._0_32_);
          auVar58 = vpmaxsd_avx2(auVar58,auVar60);
          auVar60 = vpminsd_avx512vl(auVar61,auVar120._0_32_);
          auVar59 = vpminsd_avx2(auVar59,auVar60);
          uVar24 = vpcmpd_avx512vl(auVar58,auVar59,2);
          bVar39 = (byte)uVar24;
          if (bVar39 == 0) goto LAB_01f365cf;
          auVar59 = *(undefined1 (*) [32])(uVar44 & 0xfffffffffffffff0);
          auVar60 = ((undefined1 (*) [32])(uVar44 & 0xfffffffffffffff0))[1];
          auVar61 = vmovdqa64_avx512vl(auVar124._0_32_);
          auVar61 = vpternlogd_avx512vl(auVar61,auVar58,auVar101._0_32_,0xf8);
          auVar62 = vpcompressd_avx512vl(auVar61);
          auVar64._0_4_ =
               (uint)(bVar39 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar61._0_4_;
          bVar13 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar64._4_4_ = (uint)bVar13 * auVar62._4_4_ | (uint)!bVar13 * auVar61._4_4_;
          bVar13 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar64._8_4_ = (uint)bVar13 * auVar62._8_4_ | (uint)!bVar13 * auVar61._8_4_;
          bVar13 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar64._12_4_ = (uint)bVar13 * auVar62._12_4_ | (uint)!bVar13 * auVar61._12_4_;
          bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar64._16_4_ = (uint)bVar13 * auVar62._16_4_ | (uint)!bVar13 * auVar61._16_4_;
          bVar13 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar64._20_4_ = (uint)bVar13 * auVar62._20_4_ | (uint)!bVar13 * auVar61._20_4_;
          bVar13 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar64._24_4_ = (uint)bVar13 * auVar62._24_4_ | (uint)!bVar13 * auVar61._24_4_;
          bVar13 = SUB81(uVar24 >> 7,0);
          auVar64._28_4_ = (uint)bVar13 * auVar62._28_4_ | (uint)!bVar13 * auVar61._28_4_;
          auVar61 = vpermt2q_avx512vl(auVar59,auVar64,auVar60);
          uVar44 = auVar61._0_8_;
          bVar39 = bVar39 - 1 & bVar39;
          if (bVar39 != 0) {
            auVar61 = vpshufd_avx2(auVar64,0x55);
            vpermt2q_avx512vl(auVar59,auVar61,auVar60);
            auVar62 = vpminsd_avx2(auVar64,auVar61);
            auVar61 = vpmaxsd_avx2(auVar64,auVar61);
            bVar39 = bVar39 - 1 & bVar39;
            if (bVar39 == 0) {
              auVar62 = vpermi2q_avx512vl(auVar62,auVar59,auVar60);
              uVar44 = auVar62._0_8_;
              auVar59 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
              *local_2710 = auVar59._0_8_;
              auVar58 = vpermd_avx2(auVar61,auVar58);
              *(int *)(local_2710 + 1) = auVar58._0_4_;
              local_2710 = local_2710 + 2;
            }
            else {
              auVar66 = vpshufd_avx2(auVar64,0xaa);
              vpermt2q_avx512vl(auVar59,auVar66,auVar60);
              auVar65 = vpminsd_avx2(auVar62,auVar66);
              auVar62 = vpmaxsd_avx2(auVar62,auVar66);
              auVar66 = vpminsd_avx2(auVar61,auVar62);
              auVar61 = vpmaxsd_avx2(auVar61,auVar62);
              bVar39 = bVar39 - 1 & bVar39;
              if (bVar39 == 0) {
                auVar62 = vpermi2q_avx512vl(auVar65,auVar59,auVar60);
                uVar44 = auVar62._0_8_;
                auVar62 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                *local_2710 = auVar62._0_8_;
                auVar61 = vpermd_avx2(auVar61,auVar58);
                *(int *)(local_2710 + 1) = auVar61._0_4_;
                auVar59 = vpermt2q_avx512vl(auVar59,auVar66,auVar60);
                local_2710[2] = auVar59._0_8_;
                auVar58 = vpermd_avx2(auVar66,auVar58);
                *(int *)(local_2710 + 3) = auVar58._0_4_;
                local_2710 = local_2710 + 4;
                auVar101 = ZEXT3264(CONCAT428(0xfffffff8,
                                              CONCAT424(0xfffffff8,
                                                        CONCAT420(0xfffffff8,
                                                                  CONCAT416(0xfffffff8,
                                                                            CONCAT412(0xfffffff8,
                                                                                      CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
              }
              else {
                auVar62 = vpshufd_avx2(auVar64,0xff);
                vpermt2q_avx512vl(auVar59,auVar62,auVar60);
                auVar69 = vpminsd_avx2(auVar65,auVar62);
                auVar62 = vpmaxsd_avx2(auVar65,auVar62);
                auVar65 = vpminsd_avx2(auVar66,auVar62);
                auVar62 = vpmaxsd_avx2(auVar66,auVar62);
                auVar66 = vpminsd_avx2(auVar61,auVar62);
                auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                bVar39 = bVar39 - 1 & bVar39;
                if (bVar39 == 0) {
                  auVar62 = vpermi2q_avx512vl(auVar69,auVar59,auVar60);
                  uVar44 = auVar62._0_8_;
                  auVar62 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                  *local_2710 = auVar62._0_8_;
                  auVar61 = vpermd_avx2(auVar61,auVar58);
                  *(int *)(local_2710 + 1) = auVar61._0_4_;
                  auVar61 = vpermt2q_avx512vl(auVar59,auVar66,auVar60);
                  local_2710[2] = auVar61._0_8_;
                  auVar61 = vpermd_avx2(auVar66,auVar58);
                  *(int *)(local_2710 + 3) = auVar61._0_4_;
                  auVar59 = vpermt2q_avx512vl(auVar59,auVar65,auVar60);
                  local_2710[4] = auVar59._0_8_;
                  auVar58 = vpermd_avx2(auVar65,auVar58);
                  *(int *)(local_2710 + 5) = auVar58._0_4_;
                  local_2710 = local_2710 + 6;
                }
                else {
                  auVar63 = valignd_avx512vl(auVar64,auVar64,3);
                  auVar62 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar64 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar62,auVar69);
                  auVar62 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar65 = vpermt2d_avx512vl(auVar64,auVar62,auVar65);
                  auVar65 = vpermt2d_avx512vl(auVar65,auVar62,auVar66);
                  auVar62 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar61 = vpermt2d_avx512vl(auVar65,auVar62,auVar61);
                  auVar101 = ZEXT3264(auVar61);
                  bVar40 = bVar39;
                  do {
                    auVar62 = auVar101._0_32_;
                    auVar61 = vpermps_avx512vl(auVar118._0_32_,auVar63);
                    auVar63 = valignd_avx512vl(auVar63,auVar63,1);
                    vpermt2q_avx512vl(auVar59,auVar63,auVar60);
                    bVar40 = bVar40 - 1 & bVar40;
                    uVar25 = vpcmpd_avx512vl(auVar61,auVar62,5);
                    auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                    bVar27 = (byte)uVar25 << 1;
                    auVar62 = valignd_avx512vl(auVar62,auVar62,7);
                    bVar13 = (bool)((byte)uVar25 & 1);
                    auVar66._4_4_ = (uint)bVar13 * auVar62._4_4_ | (uint)!bVar13 * auVar61._4_4_;
                    auVar66._0_4_ = auVar61._0_4_;
                    bVar13 = (bool)(bVar27 >> 2 & 1);
                    auVar66._8_4_ = (uint)bVar13 * auVar62._8_4_ | (uint)!bVar13 * auVar61._8_4_;
                    bVar13 = (bool)(bVar27 >> 3 & 1);
                    auVar66._12_4_ = (uint)bVar13 * auVar62._12_4_ | (uint)!bVar13 * auVar61._12_4_;
                    bVar13 = (bool)(bVar27 >> 4 & 1);
                    auVar66._16_4_ = (uint)bVar13 * auVar62._16_4_ | (uint)!bVar13 * auVar61._16_4_;
                    bVar13 = (bool)(bVar27 >> 5 & 1);
                    auVar66._20_4_ = (uint)bVar13 * auVar62._20_4_ | (uint)!bVar13 * auVar61._20_4_;
                    bVar13 = (bool)(bVar27 >> 6 & 1);
                    auVar66._24_4_ = (uint)bVar13 * auVar62._24_4_ | (uint)!bVar13 * auVar61._24_4_;
                    auVar66._28_4_ =
                         (uint)(bVar27 >> 7) * auVar62._28_4_ |
                         (uint)!(bool)(bVar27 >> 7) * auVar61._28_4_;
                    auVar101 = ZEXT3264(auVar66);
                  } while (bVar40 != 0);
                  lVar41 = (ulong)(uint)POPCOUNT((uint)bVar39) + 3;
                  do {
                    auVar61 = vpermi2q_avx512vl(auVar66,auVar59,auVar60);
                    *local_2710 = auVar61._0_8_;
                    auVar62 = auVar101._0_32_;
                    auVar61 = vpermd_avx2(auVar62,auVar58);
                    *(int *)(local_2710 + 1) = auVar61._0_4_;
                    auVar66 = valignd_avx512vl(auVar62,auVar62,1);
                    local_2710 = local_2710 + 2;
                    auVar101 = ZEXT3264(auVar66);
                    lVar41 = lVar41 + -1;
                  } while (lVar41 != 0);
                  auVar58 = vpermt2q_avx512vl(auVar59,auVar66,auVar60);
                  uVar44 = auVar58._0_8_;
                }
                auVar101 = ZEXT3264(CONCAT428(0xfffffff8,
                                              CONCAT424(0xfffffff8,
                                                        CONCAT420(0xfffffff8,
                                                                  CONCAT416(0xfffffff8,
                                                                            CONCAT412(0xfffffff8,
                                                                                      CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
              }
            }
          }
        }
        local_26d8 = (ulong)((uint)uVar44 & 0xf) - 8;
        if (local_26d8 != 0) {
          uVar44 = uVar44 & 0xfffffffffffffff0;
          local_26d0 = 0;
          do {
            lVar41 = local_26d0 * 0x90;
            local_26c8 = uVar44 + lVar41;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = *(ulong *)(uVar44 + 0x40 + lVar41);
            auVar82._8_8_ = 0;
            auVar82._0_8_ = *(ulong *)(uVar44 + 0x48 + lVar41);
            uVar25 = vpcmpub_avx512vl(auVar76,auVar82,2);
            uVar75 = *(undefined4 *)(uVar44 + 0x70 + lVar41);
            auVar59._4_4_ = uVar75;
            auVar59._0_4_ = uVar75;
            auVar59._8_4_ = uVar75;
            auVar59._12_4_ = uVar75;
            auVar59._16_4_ = uVar75;
            auVar59._20_4_ = uVar75;
            auVar59._24_4_ = uVar75;
            auVar59._28_4_ = uVar75;
            uVar75 = *(undefined4 *)(uVar44 + 0x7c + lVar41);
            auVar63._4_4_ = uVar75;
            auVar63._0_4_ = uVar75;
            auVar63._8_4_ = uVar75;
            auVar63._12_4_ = uVar75;
            auVar63._16_4_ = uVar75;
            auVar63._20_4_ = uVar75;
            auVar63._24_4_ = uVar75;
            auVar63._28_4_ = uVar75;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(local_26e0 + 0x40 + local_26c8);
            auVar58 = vpmovzxbd_avx2(auVar14);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar14 = vfmadd213ps_fma(auVar58,auVar63,auVar59);
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(local_26e8 + 0x40 + local_26c8);
            auVar58 = vpmovzxbd_avx2(auVar86);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar86 = vfmadd213ps_fma(auVar58,auVar63,auVar59);
            uVar75 = *(undefined4 *)(uVar44 + 0x74 + lVar41);
            auVar60._4_4_ = uVar75;
            auVar60._0_4_ = uVar75;
            auVar60._8_4_ = uVar75;
            auVar60._12_4_ = uVar75;
            auVar60._16_4_ = uVar75;
            auVar60._20_4_ = uVar75;
            auVar60._24_4_ = uVar75;
            auVar60._28_4_ = uVar75;
            uVar75 = *(undefined4 *)(uVar44 + 0x80 + lVar41);
            auVar67._4_4_ = uVar75;
            auVar67._0_4_ = uVar75;
            auVar67._8_4_ = uVar75;
            auVar67._12_4_ = uVar75;
            auVar67._16_4_ = uVar75;
            auVar67._20_4_ = uVar75;
            auVar67._24_4_ = uVar75;
            auVar67._28_4_ = uVar75;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_26f0 + 0x40 + local_26c8);
            auVar58 = vpmovzxbd_avx2(auVar3);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar55 = vfmadd213ps_fma(auVar58,auVar67,auVar60);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_26f8 + 0x40 + local_26c8);
            auVar58 = vpmovzxbd_avx2(auVar4);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar57 = vfmadd213ps_fma(auVar58,auVar67,auVar60);
            uVar75 = *(undefined4 *)(uVar44 + 0x78 + lVar41);
            auVar69._4_4_ = uVar75;
            auVar69._0_4_ = uVar75;
            auVar69._8_4_ = uVar75;
            auVar69._12_4_ = uVar75;
            auVar69._16_4_ = uVar75;
            auVar69._20_4_ = uVar75;
            auVar69._24_4_ = uVar75;
            auVar69._28_4_ = uVar75;
            uVar75 = *(undefined4 *)(uVar44 + 0x84 + lVar41);
            auVar68._4_4_ = uVar75;
            auVar68._0_4_ = uVar75;
            auVar68._8_4_ = uVar75;
            auVar68._12_4_ = uVar75;
            auVar68._16_4_ = uVar75;
            auVar68._20_4_ = uVar75;
            auVar68._24_4_ = uVar75;
            auVar68._28_4_ = uVar75;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_2700 + 0x40 + local_26c8);
            auVar58 = vpmovzxbd_avx2(auVar5);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar56 = vfmadd213ps_fma(auVar58,auVar68,auVar69);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_2708 + 0x40 + local_26c8);
            auVar58 = vpmovzxbd_avx2(auVar6);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar95 = vfmadd213ps_fma(auVar58,auVar68,auVar69);
            auVar58 = vfmadd213ps_avx512vl(ZEXT1632(auVar14),auVar115._0_32_,auVar119._0_32_);
            auVar59 = vfmadd213ps_avx512vl(ZEXT1632(auVar55),auVar116._0_32_,auVar121._0_32_);
            auVar58 = vpmaxsd_avx2(auVar58,auVar59);
            auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar56),auVar117._0_32_,auVar122._0_32_);
            auVar59 = vfmadd213ps_avx512vl(ZEXT1632(auVar86),auVar115._0_32_,auVar119._0_32_);
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar57),auVar116._0_32_,auVar121._0_32_);
            auVar59 = vpminsd_avx2(auVar59,auVar61);
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar95),auVar117._0_32_,auVar122._0_32_);
            auVar60 = vpmaxsd_avx512vl(auVar60,auVar123._0_32_);
            local_23c0 = vpmaxsd_avx2(auVar58,auVar60);
            auVar58 = vpminsd_avx512vl(auVar61,auVar120._0_32_);
            auVar58 = vpminsd_avx2(auVar59,auVar58);
            uVar26 = vpcmpd_avx512vl(local_23c0,auVar58,2);
            if ((byte)((byte)uVar26 & (byte)uVar25) != 0) {
              uVar53 = (ulong)(byte)((byte)uVar26 & (byte)uVar25);
LAB_01f35ca1:
              lVar41 = 0;
              for (uVar45 = uVar53; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                lVar41 = lVar41 + 1;
              }
              fVar80 = (ray->super_RayK<1>).tfar;
              if (*(float *)(local_23c0 + lVar41 * 4) <= fVar80) {
                uVar46 = *(uint *)(local_26c8 + 0x88);
                uVar7 = *(uint *)(local_26c8 + 4 + lVar41 * 8);
                local_2750 = (ulong)uVar46;
                pGVar8 = (context->scene->geometries).items[uVar46].ptr;
                lVar9 = *(long *)&pGVar8->field_0x58;
                lVar10 = *(long *)&pGVar8[1].time_range.upper;
                lVar42 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                         * (ulong)uVar7;
                uVar45 = *(ulong *)(local_26c8 + lVar41 * 8);
                auVar84._8_2_ = 0x7fff;
                auVar84._0_8_ = 0x7fff7fff7fff7fff;
                auVar84._10_2_ = 0x7fff;
                auVar84._12_2_ = 0x7fff;
                auVar84._14_2_ = 0x7fff;
                auVar77._8_8_ = 0;
                auVar77._0_8_ = uVar45;
                auVar14 = vpand_avx(auVar77,auVar84);
                auVar95 = vpmovzxwd_avx(auVar14);
                auVar85._8_8_ = 0;
                auVar85._0_8_ = *(ulong *)(lVar9 + lVar42);
                auVar14 = vpaddd_avx(auVar85,auVar95);
                auVar86 = vpmulld_avx(auVar85,auVar95);
                auVar86 = vpsrlq_avx(auVar86,0x20);
                auVar14 = vpaddd_avx(auVar14,auVar86);
                lVar52 = CONCAT44((int)((ulong)ray >> 0x20),auVar14._0_4_);
                p_Var11 = pGVar8[1].intersectionFilterN;
                auVar14 = *(undefined1 (*) [16])(lVar10 + (lVar52 + 1) * (long)p_Var11);
                uVar48 = *(ulong *)(lVar9 + lVar42) >> 0x20;
                lVar41 = uVar48 + lVar52 + 1;
                auVar86 = *(undefined1 (*) [16])(lVar10 + (uVar48 + lVar52) * (long)p_Var11);
                auVar55 = *(undefined1 (*) [16])(lVar10 + lVar41 * (long)p_Var11);
                uVar47 = (ulong)(-1 < (short)uVar45);
                auVar57 = *(undefined1 (*) [16])(lVar10 + (lVar52 + uVar47 + 1) * (long)p_Var11);
                lVar51 = uVar47 + lVar41;
                auVar56 = *(undefined1 (*) [16])(lVar10 + lVar51 * (long)p_Var11);
                uVar47 = 0;
                if (-1 < (short)(uVar45 >> 0x10)) {
                  uVar47 = uVar48;
                }
                auVar3 = *(undefined1 (*) [16])(lVar10 + (uVar48 + lVar52 + uVar47) * (long)p_Var11)
                ;
                auVar4 = *(undefined1 (*) [16])(lVar10 + (lVar41 + uVar47) * (long)p_Var11);
                auVar106._16_16_ =
                     *(undefined1 (*) [16])(lVar10 + (uVar47 + lVar51) * (long)p_Var11);
                auVar106._0_16_ = auVar55;
                auVar6 = vunpcklps_avx(auVar14,auVar56);
                auVar5 = vunpckhps_avx(auVar14,auVar56);
                auVar76 = vunpcklps_avx(auVar57,auVar55);
                auVar57 = vunpckhps_avx(auVar57,auVar55);
                auVar82 = vunpcklps_avx(auVar5,auVar57);
                auVar77 = vunpcklps_avx(auVar6,auVar76);
                auVar57 = vunpckhps_avx(auVar6,auVar76);
                auVar6 = vunpcklps_avx(auVar86,auVar4);
                auVar5 = vunpckhps_avx(auVar86,auVar4);
                auVar76 = vunpcklps_avx(auVar55,auVar3);
                auVar3 = vunpckhps_avx(auVar55,auVar3);
                auVar5 = vunpcklps_avx(auVar5,auVar3);
                auVar84 = vunpcklps_avx(auVar6,auVar76);
                auVar3 = vunpckhps_avx(auVar6,auVar76);
                auVar98._16_16_ = auVar4;
                auVar98._0_16_ = auVar86;
                auVar91._16_16_ = auVar56;
                auVar91._0_16_ = auVar14;
                auVar58 = vunpcklps_avx(auVar91,auVar98);
                auVar87._16_16_ = auVar55;
                auVar87._0_16_ = *(undefined1 (*) [16])(lVar10 + (long)p_Var11 * lVar52);
                auVar59 = vunpcklps_avx(auVar87,auVar106);
                auVar66 = vunpcklps_avx(auVar59,auVar58);
                auVar64 = vunpckhps_avx(auVar59,auVar58);
                auVar58 = vunpckhps_avx(auVar91,auVar98);
                auVar59 = vunpckhps_avx(auVar87,auVar106);
                auVar69 = vunpcklps_avx(auVar59,auVar58);
                auVar58._16_16_ = auVar77;
                auVar58._0_16_ = auVar77;
                auVar93._16_16_ = auVar57;
                auVar93._0_16_ = auVar57;
                auVar99._16_16_ = auVar82;
                auVar99._0_16_ = auVar82;
                auVar100._16_16_ = auVar84;
                auVar100._0_16_ = auVar84;
                auVar107._16_16_ = auVar3;
                auVar107._0_16_ = auVar3;
                auVar103._16_16_ = auVar5;
                auVar103._0_16_ = auVar5;
                auVar58 = vsubps_avx(auVar66,auVar58);
                auVar59 = vsubps_avx(auVar64,auVar93);
                auVar60 = vsubps_avx(auVar69,auVar99);
                auVar61 = vsubps_avx(auVar100,auVar66);
                auVar62 = vsubps_avx(auVar107,auVar64);
                auVar65 = vsubps_avx(auVar103,auVar69);
                auVar33._4_4_ = auVar59._4_4_ * auVar65._4_4_;
                auVar33._0_4_ = auVar59._0_4_ * auVar65._0_4_;
                auVar33._8_4_ = auVar59._8_4_ * auVar65._8_4_;
                auVar33._12_4_ = auVar59._12_4_ * auVar65._12_4_;
                auVar33._16_4_ = auVar59._16_4_ * auVar65._16_4_;
                auVar33._20_4_ = auVar59._20_4_ * auVar65._20_4_;
                auVar33._24_4_ = auVar59._24_4_ * auVar65._24_4_;
                auVar33._28_4_ = auVar77._12_4_;
                auVar14 = vfmsub231ps_fma(auVar33,auVar62,auVar60);
                auVar34._4_4_ = auVar60._4_4_ * auVar61._4_4_;
                auVar34._0_4_ = auVar60._0_4_ * auVar61._0_4_;
                auVar34._8_4_ = auVar60._8_4_ * auVar61._8_4_;
                auVar34._12_4_ = auVar60._12_4_ * auVar61._12_4_;
                auVar34._16_4_ = auVar60._16_4_ * auVar61._16_4_;
                auVar34._20_4_ = auVar60._20_4_ * auVar61._20_4_;
                auVar34._24_4_ = auVar60._24_4_ * auVar61._24_4_;
                auVar34._28_4_ = auVar57._12_4_;
                auVar86 = vfmsub231ps_fma(auVar34,auVar65,auVar58);
                auVar35._4_4_ = auVar58._4_4_ * auVar62._4_4_;
                auVar35._0_4_ = auVar58._0_4_ * auVar62._0_4_;
                auVar35._8_4_ = auVar58._8_4_ * auVar62._8_4_;
                auVar35._12_4_ = auVar58._12_4_ * auVar62._12_4_;
                auVar35._16_4_ = auVar58._16_4_ * auVar62._16_4_;
                auVar35._20_4_ = auVar58._20_4_ * auVar62._20_4_;
                auVar35._24_4_ = auVar58._24_4_ * auVar62._24_4_;
                auVar35._28_4_ = auVar82._12_4_;
                auVar63 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
                auVar67 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
                auVar68 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
                uVar75 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
                auVar70._4_4_ = uVar75;
                auVar70._0_4_ = uVar75;
                auVar70._8_4_ = uVar75;
                auVar70._12_4_ = uVar75;
                auVar70._16_4_ = uVar75;
                auVar70._20_4_ = uVar75;
                auVar70._24_4_ = uVar75;
                auVar70._28_4_ = uVar75;
                auVar66 = vsubps_avx512vl(auVar66,auVar70);
                auVar55 = vfmsub231ps_fma(auVar35,auVar61,auVar59);
                uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
                auVar71._4_4_ = uVar75;
                auVar71._0_4_ = uVar75;
                auVar71._8_4_ = uVar75;
                auVar71._12_4_ = uVar75;
                auVar71._16_4_ = uVar75;
                auVar71._20_4_ = uVar75;
                auVar71._24_4_ = uVar75;
                auVar71._28_4_ = uVar75;
                auVar64 = vsubps_avx512vl(auVar64,auVar71);
                uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                auVar72._4_4_ = uVar75;
                auVar72._0_4_ = uVar75;
                auVar72._8_4_ = uVar75;
                auVar72._12_4_ = uVar75;
                auVar72._16_4_ = uVar75;
                auVar72._20_4_ = uVar75;
                auVar72._24_4_ = uVar75;
                auVar72._28_4_ = uVar75;
                auVar69 = vsubps_avx512vl(auVar69,auVar72);
                auVar70 = vmulps_avx512vl(auVar67,auVar69);
                auVar70 = vfmsub231ps_avx512vl(auVar70,auVar64,auVar68);
                auVar71 = vmulps_avx512vl(auVar68,auVar66);
                auVar71 = vfmsub231ps_avx512vl(auVar71,auVar69,auVar63);
                auVar72 = vmulps_avx512vl(auVar63,auVar64);
                auVar72 = vfmsub231ps_avx512vl(auVar72,auVar66,auVar67);
                auVar68 = vmulps_avx512vl(auVar68,ZEXT1632(auVar55));
                auVar67 = vfmadd231ps_avx512vl(auVar68,ZEXT1632(auVar86),auVar67);
                local_25c0 = vfmadd231ps_avx512vl(auVar67,ZEXT1632(auVar14),auVar63);
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar28._16_4_ = 0x7fffffff;
                auVar28._20_4_ = 0x7fffffff;
                auVar28._24_4_ = 0x7fffffff;
                auVar28._28_4_ = 0x7fffffff;
                vandps_avx512vl(local_25c0,auVar28);
                auVar65 = vmulps_avx512vl(auVar65,auVar72);
                auVar62 = vfmadd231ps_avx512vl(auVar65,auVar71,auVar62);
                auVar61 = vfmadd231ps_avx512vl(auVar62,auVar70,auVar61);
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar29._16_4_ = 0x80000000;
                auVar29._20_4_ = 0x80000000;
                auVar29._24_4_ = 0x80000000;
                auVar29._28_4_ = 0x80000000;
                auVar62 = vandpd_avx512vl(local_25c0,auVar29);
                uVar54 = auVar62._0_4_;
                auVar102._0_4_ = (float)(uVar54 ^ auVar61._0_4_);
                uVar43 = auVar62._4_4_;
                auVar102._4_4_ = (float)(uVar43 ^ auVar61._4_4_);
                uVar109 = auVar62._8_4_;
                auVar102._8_4_ = (float)(uVar109 ^ auVar61._8_4_);
                uVar110 = auVar62._12_4_;
                auVar102._12_4_ = (float)(uVar110 ^ auVar61._12_4_);
                fVar81 = auVar62._16_4_;
                auVar102._16_4_ = (float)((uint)fVar81 ^ auVar61._16_4_);
                fVar111 = auVar62._20_4_;
                auVar102._20_4_ = (float)((uint)fVar111 ^ auVar61._20_4_);
                fVar112 = auVar62._24_4_;
                auVar102._24_4_ = (float)((uint)fVar112 ^ auVar61._24_4_);
                uVar113 = auVar62._28_4_;
                auVar102._28_4_ = (float)(uVar113 ^ auVar61._28_4_);
                auVar60 = vmulps_avx512vl(auVar60,auVar72);
                auVar59 = vfmadd231ps_avx512vl(auVar60,auVar59,auVar71);
                auVar58 = vfmadd231ps_avx512vl(auVar59,auVar58,auVar70);
                auVar108._0_4_ = (float)(uVar54 ^ auVar58._0_4_);
                auVar108._4_4_ = (float)(uVar43 ^ auVar58._4_4_);
                auVar108._8_4_ = (float)(uVar109 ^ auVar58._8_4_);
                auVar108._12_4_ = (float)(uVar110 ^ auVar58._12_4_);
                auVar108._16_4_ = (float)((uint)fVar81 ^ auVar58._16_4_);
                auVar108._20_4_ = (float)((uint)fVar111 ^ auVar58._20_4_);
                auVar108._24_4_ = (float)((uint)fVar112 ^ auVar58._24_4_);
                auVar108._28_4_ = (float)(uVar113 ^ auVar58._28_4_);
                uVar25 = vcmpps_avx512vl(auVar102,ZEXT832(0) << 0x20,5);
                uVar26 = vcmpps_avx512vl(auVar108,ZEXT832(0) << 0x20,5);
                uVar22 = vcmpps_avx512vl(local_25c0,ZEXT832(0) << 0x20,4);
                auVar114._0_4_ = auVar108._0_4_ + auVar102._0_4_;
                auVar114._4_4_ = auVar108._4_4_ + auVar102._4_4_;
                auVar114._8_4_ = auVar108._8_4_ + auVar102._8_4_;
                auVar114._12_4_ = auVar108._12_4_ + auVar102._12_4_;
                auVar114._16_4_ = auVar108._16_4_ + auVar102._16_4_;
                auVar114._20_4_ = auVar108._20_4_ + auVar102._20_4_;
                auVar114._24_4_ = auVar108._24_4_ + auVar102._24_4_;
                auVar114._28_4_ = auVar108._28_4_ + auVar102._28_4_;
                uVar23 = vcmpps_avx512vl(auVar114,local_25c0,2);
                local_259f = (byte)uVar25 & (byte)uVar26 & (byte)uVar22 & (byte)uVar23;
                if (local_259f != 0) {
                  auVar36._4_4_ = auVar69._4_4_ * auVar55._4_4_;
                  auVar36._0_4_ = auVar69._0_4_ * auVar55._0_4_;
                  auVar36._8_4_ = auVar69._8_4_ * auVar55._8_4_;
                  auVar36._12_4_ = auVar69._12_4_ * auVar55._12_4_;
                  auVar36._16_4_ = auVar69._16_4_ * 0.0;
                  auVar36._20_4_ = auVar69._20_4_ * 0.0;
                  auVar36._24_4_ = auVar69._24_4_ * 0.0;
                  auVar36._28_4_ = auVar69._28_4_;
                  auVar57 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar86),auVar36);
                  auVar57 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar14),ZEXT1632(auVar57));
                  local_25e0._0_4_ = (float)(uVar54 ^ auVar57._0_4_);
                  local_25e0._4_4_ = (float)(uVar43 ^ auVar57._4_4_);
                  local_25e0._8_4_ = (float)(uVar109 ^ auVar57._8_4_);
                  local_25e0._12_4_ = (float)(uVar110 ^ auVar57._12_4_);
                  local_25e0._16_4_ = fVar81;
                  local_25e0._20_4_ = fVar111;
                  local_25e0._24_4_ = fVar112;
                  local_25e0._28_4_ = uVar113;
                  uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
                  auVar30._4_4_ = uVar75;
                  auVar30._0_4_ = uVar75;
                  auVar30._8_4_ = uVar75;
                  auVar30._12_4_ = uVar75;
                  auVar30._16_4_ = uVar75;
                  auVar30._20_4_ = uVar75;
                  auVar30._24_4_ = uVar75;
                  auVar30._28_4_ = uVar75;
                  auVar58 = vmulps_avx512vl(local_25c0,auVar30);
                  fVar15 = local_25c0._0_4_;
                  fVar16 = local_25c0._4_4_;
                  auVar37._4_4_ = fVar80 * fVar16;
                  auVar37._0_4_ = fVar80 * fVar15;
                  fVar17 = local_25c0._8_4_;
                  auVar37._8_4_ = fVar80 * fVar17;
                  fVar18 = local_25c0._12_4_;
                  auVar37._12_4_ = fVar80 * fVar18;
                  fVar19 = local_25c0._16_4_;
                  auVar37._16_4_ = fVar80 * fVar19;
                  fVar20 = local_25c0._20_4_;
                  auVar37._20_4_ = fVar80 * fVar20;
                  fVar21 = local_25c0._24_4_;
                  auVar37._24_4_ = fVar80 * fVar21;
                  auVar37._28_4_ = fVar80;
                  uVar25 = vcmpps_avx512vl(local_25e0,auVar37,2);
                  uVar26 = vcmpps_avx512vl(auVar58,local_25e0,1);
                  local_259f = (byte)uVar25 & (byte)uVar26 & local_259f;
                  uVar54 = (uint)local_259f;
                  if (local_259f != 0) {
                    uVar43 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                                     ((long)&(ray->super_RayK<1>).org.field_0 + 0xc)
                                                    ,0x10),2);
                    auVar58 = vsubps_avx(local_25c0,auVar102);
                    local_2600 = vblendps_avx(auVar108,auVar58,0xf0);
                    auVar58 = vsubps_avx(local_25c0,auVar108);
                    fVar80 = (float)DAT_01fef940;
                    local_2520._0_4_ = fVar80 * auVar14._0_4_;
                    fVar83 = DAT_01fef940._4_4_;
                    local_2520._4_4_ = fVar83 * auVar14._4_4_;
                    fVar88 = DAT_01fef940._8_4_;
                    local_2520._8_4_ = fVar88 * auVar14._8_4_;
                    fVar89 = DAT_01fef940._12_4_;
                    local_2520._12_4_ = fVar89 * auVar14._12_4_;
                    fVar90 = DAT_01fef940._16_4_;
                    local_2520._16_4_ = fVar90 * 0.0;
                    fVar104 = DAT_01fef940._20_4_;
                    local_2520._20_4_ = fVar104 * 0.0;
                    fVar105 = DAT_01fef940._24_4_;
                    local_2520._24_4_ = fVar105 * 0.0;
                    local_2520._28_4_ = 0;
                    local_2500._4_4_ = fVar83 * auVar86._4_4_;
                    local_2500._0_4_ = fVar80 * auVar86._0_4_;
                    local_2500._8_4_ = fVar88 * auVar86._8_4_;
                    local_2500._12_4_ = fVar89 * auVar86._12_4_;
                    local_2500._16_4_ = fVar90 * 0.0;
                    local_2500._20_4_ = fVar104 * 0.0;
                    local_2500._24_4_ = fVar105 * 0.0;
                    local_2500._28_4_ = 0;
                    auVar58 = vblendps_avx(auVar102,auVar58,0xf0);
                    local_24e0._0_4_ = fVar80 * auVar55._0_4_;
                    local_24e0._4_4_ = fVar83 * auVar55._4_4_;
                    local_24e0._8_4_ = fVar88 * auVar55._8_4_;
                    local_24e0._12_4_ = fVar89 * auVar55._12_4_;
                    local_24e0._16_4_ = fVar90 * 0.0;
                    local_24e0._20_4_ = fVar104 * 0.0;
                    local_24e0._24_4_ = fVar105 * 0.0;
                    local_24e0._28_4_ = 0;
                    uVar75 = auVar95._0_4_;
                    auVar94._4_4_ = uVar75;
                    auVar94._0_4_ = uVar75;
                    auVar94._8_4_ = uVar75;
                    auVar94._12_4_ = uVar75;
                    auVar94._16_4_ = uVar75;
                    auVar94._20_4_ = uVar75;
                    auVar94._24_4_ = uVar75;
                    auVar94._28_4_ = uVar75;
                    auVar59 = vpaddd_avx2(auVar94,_DAT_01fec4a0);
                    auVar96._0_4_ = (float)(int)(*(ushort *)(lVar9 + 8 + lVar42) - 1);
                    auVar96._4_12_ = auVar95._4_12_;
                    auVar38._12_4_ = 0;
                    auVar38._0_12_ = ZEXT812(0);
                    auVar86 = vrcp14ss_avx512f(auVar38 << 0x20,ZEXT416((uint)auVar96._0_4_));
                    auVar14 = vfnmadd213ss_fma(auVar86,auVar96,ZEXT416(0x40000000));
                    fStack_2608 = auVar14._0_4_ * auVar86._0_4_;
                    auVar59 = vcvtdq2ps_avx(auVar59);
                    local_2620 = (fVar15 * auVar59._0_4_ + auVar58._0_4_) * fStack_2608;
                    fStack_261c = (fVar16 * auVar59._4_4_ + auVar58._4_4_) * fStack_2608;
                    fStack_2618 = (fVar17 * auVar59._8_4_ + auVar58._8_4_) * fStack_2608;
                    fStack_2614 = (fVar18 * auVar59._12_4_ + auVar58._12_4_) * fStack_2608;
                    fStack_2610 = (fVar19 * auVar59._16_4_ + auVar58._16_4_) * fStack_2608;
                    fStack_260c = (fVar20 * auVar59._20_4_ + auVar58._20_4_) * fStack_2608;
                    fStack_2608 = (fVar21 * auVar59._24_4_ + auVar58._24_4_) * fStack_2608;
                    fStack_2604 = auVar59._28_4_ + auVar58._28_4_;
                    if ((pGVar8->mask & uVar43) != 0) {
                      auVar58 = vpermps_avx512vl(auVar118._0_32_,ZEXT1632(auVar95));
                      auVar58 = vpaddd_avx2(auVar58,_DAT_01fec4c0);
                      auVar58 = vcvtdq2ps_avx(auVar58);
                      auVar14 = vcvtsi2ss_avx512f(auVar115._0_16_,
                                                  *(ushort *)(lVar9 + 10 + lVar42) - 1);
                      auVar97._0_12_ = ZEXT812(0);
                      auVar97._12_4_ = 0;
                      auVar92._4_8_ = auVar97._4_8_;
                      auVar92._0_4_ = auVar14._0_4_;
                      auVar92._12_4_ = 0;
                      auVar86 = vrcp14ss_avx512f(auVar97,auVar92);
                      auVar14 = vfnmadd213ss_fma(auVar86,auVar14,ZEXT416(0x40000000));
                      fVar80 = auVar86._0_4_ * auVar14._0_4_;
                      auVar59 = vrcp14ps_avx512vl(local_25c0);
                      auVar31._8_4_ = 0x3f800000;
                      auVar31._0_8_ = 0x3f8000003f800000;
                      auVar31._12_4_ = 0x3f800000;
                      auVar31._16_4_ = 0x3f800000;
                      auVar31._20_4_ = 0x3f800000;
                      auVar31._24_4_ = 0x3f800000;
                      auVar31._28_4_ = 0x3f800000;
                      auVar60 = vfnmadd213ps_avx512vl(local_25c0,auVar59,auVar31);
                      auVar14 = vfmadd132ps_fma(auVar60,auVar59,auVar59);
                      fVar83 = auVar14._0_4_;
                      local_2540._0_4_ = fVar83 * local_25e0._0_4_;
                      fVar88 = auVar14._4_4_;
                      local_2540._4_4_ = fVar88 * local_25e0._4_4_;
                      fVar89 = auVar14._8_4_;
                      local_2540._8_4_ = fVar89 * local_25e0._8_4_;
                      fVar90 = auVar14._12_4_;
                      local_2540._12_4_ = fVar90 * local_25e0._12_4_;
                      local_2540._16_4_ = fVar81 * 0.0;
                      local_2540._20_4_ = fVar111 * 0.0;
                      local_2540._24_4_ = fVar112 * 0.0;
                      local_2540._28_4_ = 0;
                      auVar101 = ZEXT3264(local_2540);
                      local_2580[0] = local_2620 * fVar83;
                      local_2580[1] = fStack_261c * fVar88;
                      local_2580[2] = fStack_2618 * fVar89;
                      local_2580[3] = fStack_2614 * fVar90;
                      fStack_2570 = fStack_2610 * 0.0;
                      fStack_256c = fStack_260c * 0.0;
                      fStack_2568 = fStack_2608 * 0.0;
                      uStack_2564 = auVar59._28_4_;
                      local_2560[0] = (fVar15 * auVar58._0_4_ + local_2600._0_4_) * fVar80 * fVar83;
                      local_2560[1] = (fVar16 * auVar58._4_4_ + local_2600._4_4_) * fVar80 * fVar88;
                      local_2560[2] = (fVar17 * auVar58._8_4_ + local_2600._8_4_) * fVar80 * fVar89;
                      local_2560[3] =
                           (fVar18 * auVar58._12_4_ + local_2600._12_4_) * fVar80 * fVar90;
                      fStack_2550 = (fVar19 * auVar58._16_4_ + local_2600._16_4_) * fVar80 * 0.0;
                      fStack_254c = (fVar20 * auVar58._20_4_ + local_2600._20_4_) * fVar80 * 0.0;
                      fStack_2548 = (fVar21 * auVar58._24_4_ + local_2600._24_4_) * fVar80 * 0.0;
                      fStack_2544 = auVar58._28_4_ + local_2600._28_4_;
                      auVar78._8_4_ = 0x7f800000;
                      auVar78._0_8_ = 0x7f8000007f800000;
                      auVar78._12_4_ = 0x7f800000;
                      auVar78._16_4_ = 0x7f800000;
                      auVar78._20_4_ = 0x7f800000;
                      auVar78._24_4_ = 0x7f800000;
                      auVar78._28_4_ = 0x7f800000;
                      auVar58 = vblendmps_avx512vl(auVar78,local_2540);
                      auVar73._0_4_ =
                           (uint)(local_259f & 1) * auVar58._0_4_ |
                           (uint)!(bool)(local_259f & 1) * 0x7f800000;
                      bVar13 = (bool)(local_259f >> 1 & 1);
                      auVar73._4_4_ = (uint)bVar13 * auVar58._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(local_259f >> 2 & 1);
                      auVar73._8_4_ = (uint)bVar13 * auVar58._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(local_259f >> 3 & 1);
                      auVar73._12_4_ = (uint)bVar13 * auVar58._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(local_259f >> 4 & 1);
                      auVar73._16_4_ = (uint)bVar13 * auVar58._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(local_259f >> 5 & 1);
                      auVar73._20_4_ = (uint)bVar13 * auVar58._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(local_259f >> 6 & 1);
                      auVar73._24_4_ = (uint)bVar13 * auVar58._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar73._28_4_ =
                           (uint)(local_259f >> 7) * auVar58._28_4_ |
                           (uint)!(bool)(local_259f >> 7) * 0x7f800000;
                      auVar58 = vshufps_avx(auVar73,auVar73,0xb1);
                      auVar58 = vminps_avx(auVar73,auVar58);
                      auVar59 = vshufpd_avx(auVar58,auVar58,5);
                      auVar58 = vminps_avx(auVar58,auVar59);
                      auVar59 = vpermpd_avx2(auVar58,0x4e);
                      auVar58 = vminps_avx(auVar58,auVar59);
                      uVar25 = vcmpps_avx512vl(auVar73,auVar58,0);
                      uVar43 = uVar54;
                      if ((local_259f & (byte)uVar25) != 0) {
                        uVar43 = (uint)(local_259f & (byte)uVar25);
                      }
                      uVar109 = 0;
                      for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x80000000) {
                        uVar109 = uVar109 + 1;
                      }
                      local_2758 = (ulong)uVar109;
                      local_2760 = context->args;
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_2640 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                        local_24c0 = auVar123._0_32_;
                        local_24a0 = auVar122._0_32_;
                        local_2480 = auVar121._0_32_;
                        local_2460 = auVar120._0_32_;
                        local_2440 = auVar119._0_32_;
                        local_2420 = auVar117._0_32_;
                        local_2400 = auVar116._0_32_;
                        local_23e0 = auVar115._0_32_;
                        local_2748 = context->user;
                        local_2660 = local_2540;
                        do {
                          local_2684 = local_2580[local_2758];
                          local_2680 = local_2560[local_2758];
                          (ray->super_RayK<1>).tfar = *(float *)(local_2540 + local_2758 * 4);
                          local_2690 = *(float *)(local_2520 + local_2758 * 4);
                          local_268c = *(undefined4 *)(local_2500 + local_2758 * 4);
                          local_2688 = *(undefined4 *)(local_24e0 + local_2758 * 4);
                          local_267c = uVar7;
                          local_2678 = (int)local_2750;
                          local_2674 = local_2748->instID[0];
                          local_2670 = local_2748->instPrimID[0];
                          local_2764 = -1;
                          local_26c0.valid = &local_2764;
                          local_26c0.geometryUserPtr = pGVar8->userPtr;
                          local_26c0.context = local_2748;
                          local_26c0.ray = (RTCRayN *)ray;
                          local_26c0.hit = (RTCHitN *)&local_2690;
                          local_26c0.N = 1;
                          if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f363d4:
                            if ((local_2760->filter != (RTCFilterFunctionN)0x0) &&
                               (((local_2760->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              (*local_2760->filter)(&local_26c0);
                              auVar101 = ZEXT3264(local_2660);
                              if (*local_26c0.valid == 0) goto LAB_01f36482;
                            }
                            uVar46 = (uint)local_2758;
                            (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                                 *(float *)local_26c0.hit;
                            (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_26c0.hit + 4);
                            (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_26c0.hit + 8);
                            *(float *)((long)local_26c0.ray + 0x3c) =
                                 *(float *)(local_26c0.hit + 0xc);
                            *(float *)((long)local_26c0.ray + 0x40) =
                                 *(float *)(local_26c0.hit + 0x10);
                            *(float *)((long)local_26c0.ray + 0x44) =
                                 *(float *)(local_26c0.hit + 0x14);
                            *(float *)((long)local_26c0.ray + 0x48) =
                                 *(float *)(local_26c0.hit + 0x18);
                            *(float *)((long)local_26c0.ray + 0x4c) =
                                 *(float *)(local_26c0.hit + 0x1c);
                            *(float *)((long)local_26c0.ray + 0x50) =
                                 *(float *)(local_26c0.hit + 0x20);
                          }
                          else {
                            (*pGVar8->intersectionFilterN)(&local_26c0);
                            auVar101 = ZEXT3264(local_2660);
                            if (*local_26c0.valid != 0) goto LAB_01f363d4;
LAB_01f36482:
                            uVar46 = (uint)local_2758;
                            (ray->super_RayK<1>).tfar = (float)local_2640._0_4_;
                          }
                          bVar39 = ~(byte)(1 << (uVar46 & 0x1f)) & (byte)uVar54;
                          fVar80 = (ray->super_RayK<1>).tfar;
                          auVar32._4_4_ = fVar80;
                          auVar32._0_4_ = fVar80;
                          auVar32._8_4_ = fVar80;
                          auVar32._12_4_ = fVar80;
                          auVar32._16_4_ = fVar80;
                          auVar32._20_4_ = fVar80;
                          auVar32._24_4_ = fVar80;
                          auVar32._28_4_ = fVar80;
                          uVar25 = vcmpps_avx512vl(auVar101._0_32_,auVar32,2);
                          if ((bVar39 & (byte)uVar25) == 0) goto LAB_01f36522;
                          local_2640 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                          bVar39 = bVar39 & (byte)uVar25;
                          uVar54 = (uint)bVar39;
                          auVar79._8_4_ = 0x7f800000;
                          auVar79._0_8_ = 0x7f8000007f800000;
                          auVar79._12_4_ = 0x7f800000;
                          auVar79._16_4_ = 0x7f800000;
                          auVar79._20_4_ = 0x7f800000;
                          auVar79._24_4_ = 0x7f800000;
                          auVar79._28_4_ = 0x7f800000;
                          auVar58 = vblendmps_avx512vl(auVar79,auVar101._0_32_);
                          auVar74._0_4_ =
                               (uint)(bVar39 & 1) * auVar58._0_4_ |
                               (uint)!(bool)(bVar39 & 1) * 0x7f800000;
                          bVar13 = (bool)(bVar39 >> 1 & 1);
                          auVar74._4_4_ = (uint)bVar13 * auVar58._4_4_ | (uint)!bVar13 * 0x7f800000;
                          bVar13 = (bool)(bVar39 >> 2 & 1);
                          auVar74._8_4_ = (uint)bVar13 * auVar58._8_4_ | (uint)!bVar13 * 0x7f800000;
                          bVar13 = (bool)(bVar39 >> 3 & 1);
                          auVar74._12_4_ =
                               (uint)bVar13 * auVar58._12_4_ | (uint)!bVar13 * 0x7f800000;
                          bVar13 = (bool)(bVar39 >> 4 & 1);
                          auVar74._16_4_ =
                               (uint)bVar13 * auVar58._16_4_ | (uint)!bVar13 * 0x7f800000;
                          bVar13 = (bool)(bVar39 >> 5 & 1);
                          auVar74._20_4_ =
                               (uint)bVar13 * auVar58._20_4_ | (uint)!bVar13 * 0x7f800000;
                          bVar13 = (bool)(bVar39 >> 6 & 1);
                          auVar74._24_4_ =
                               (uint)bVar13 * auVar58._24_4_ | (uint)!bVar13 * 0x7f800000;
                          auVar74._28_4_ =
                               (uint)(bVar39 >> 7) * auVar58._28_4_ |
                               (uint)!(bool)(bVar39 >> 7) * 0x7f800000;
                          auVar58 = vshufps_avx(auVar74,auVar74,0xb1);
                          auVar58 = vminps_avx(auVar74,auVar58);
                          auVar59 = vshufpd_avx(auVar58,auVar58,5);
                          auVar58 = vminps_avx(auVar58,auVar59);
                          auVar59 = vpermpd_avx2(auVar58,0x4e);
                          auVar58 = vminps_avx(auVar58,auVar59);
                          uVar25 = vcmpps_avx512vl(auVar74,auVar58,0);
                          bVar40 = (byte)uVar25 & bVar39;
                          if (bVar40 != 0) {
                            bVar39 = bVar40;
                          }
                          uVar46 = 0;
                          for (uVar43 = (uint)bVar39; (uVar43 & 1) == 0;
                              uVar43 = uVar43 >> 1 | 0x80000000) {
                            uVar46 = uVar46 + 1;
                          }
                          local_2758 = (ulong)uVar46;
                        } while( true );
                      }
                      fVar80 = local_2580[local_2758];
                      fVar81 = local_2560[local_2758];
                      fVar15 = *(float *)(local_2520 + local_2758 * 4);
                      fVar111 = *(float *)(local_2500 + local_2758 * 4);
                      fVar112 = *(float *)(local_24e0 + local_2758 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_2540 + local_2758 * 4);
                      (ray->Ng).field_0.field_0.x = fVar15;
                      (ray->Ng).field_0.field_0.y = fVar111;
                      (ray->Ng).field_0.field_0.z = fVar112;
                      ray->u = fVar80;
                      ray->v = fVar81;
                      ray->primID = uVar7;
                      ray->geomID = uVar46;
                      pRVar12 = context->user;
                      ray->instID[0] = pRVar12->instID[0];
                      ray->instPrimID[0] = pRVar12->instPrimID[0];
                    }
                  }
                }
              }
              goto LAB_01f35f8a;
            }
LAB_01f3657b:
            local_26d0 = local_26d0 + 1;
          } while (local_26d0 != local_26d8);
        }
        auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
        auVar120 = ZEXT3264(auVar58);
        auVar101 = ZEXT3264(CONCAT428(0xfffffff8,
                                      CONCAT424(0xfffffff8,
                                                CONCAT420(0xfffffff8,
                                                          CONCAT416(0xfffffff8,
                                                                    CONCAT412(0xfffffff8,
                                                                              CONCAT48(0xfffffff8,
                                                                                                                                                                              
                                                  0xfffffff8fffffff8)))))));
        uVar53 = local_2718;
        uVar45 = local_2720;
        uVar47 = local_2728;
        uVar48 = local_2730;
        uVar49 = local_2738;
        uVar50 = local_2740;
      }
LAB_01f365cf:
    } while (local_2710 != &local_23a0);
  }
  return;
LAB_01f36522:
  auVar115 = ZEXT3264(local_23e0);
  auVar116 = ZEXT3264(local_2400);
  auVar117 = ZEXT3264(local_2420);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar118 = ZEXT3264(auVar58);
  auVar119 = ZEXT3264(local_2440);
  auVar120 = ZEXT3264(local_2460);
  auVar121 = ZEXT3264(local_2480);
  auVar122 = ZEXT3264(local_24a0);
  auVar123 = ZEXT3264(local_24c0);
  auVar58 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar124 = ZEXT3264(auVar58);
LAB_01f35f8a:
  uVar53 = uVar53 - 1 & uVar53;
  if (uVar53 == 0) goto LAB_01f3657b;
  goto LAB_01f35ca1;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }